

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.cpp
# Opt level: O2

void __thiscall ki::protocol::dml::MessageHeader::write_to(MessageHeader *this,ostream *ostream)

{
  Field<unsigned_char> *pFVar1;
  Field<unsigned_short> *pFVar2;
  allocator local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  Record record;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)&local_80,"m_service_id",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(&record,&local_80,true);
  pFVar1->m_value = this->m_service_id;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"m_type",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(&record,&local_a0,true);
  pFVar1->m_value = this->m_type;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,"m_size",&local_c1);
  pFVar2 = ki::dml::Record::add_field<unsigned_short>(&record,&local_c0,true);
  pFVar2->m_value = this->m_size + 4;
  std::__cxx11::string::~string((string *)&local_c0);
  ki::dml::Record::write_to(&record,ostream);
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void MessageHeader::write_to(std::ostream& ostream) const
	{
		ki::dml::Record record;
		record.add_field<ki::dml::UBYT>("m_service_id")->set_value(m_service_id);
		record.add_field<ki::dml::UBYT>("m_type")->set_value(m_type);
		record.add_field<ki::dml::USHRT>("m_size")->set_value(m_size + 4);
		record.write_to(ostream);
	}